

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QKmsPlane>::copyAppend
          (QGenericArrayOps<QKmsPlane> *this,QKmsPlane *b,QKmsPlane *e)

{
  qsizetype *pqVar1;
  QKmsPlane *pQVar2;
  long lVar3;
  Data *pDVar4;
  Type TVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  Rotations RVar17;
  Rotations RVar18;
  uint32_t uVar19;
  uint32_t uVar20;
  
  if ((b != e) && (b < e)) {
    pQVar2 = (this->super_QArrayDataPointer<QKmsPlane>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QKmsPlane>).size;
      pQVar2[lVar3].possibleCrtcs = b->possibleCrtcs;
      TVar5 = b->type;
      pQVar2[lVar3].id = b->id;
      pQVar2[lVar3].type = TVar5;
      pDVar4 = (b->supportedFormats).d.d;
      pQVar2[lVar3].supportedFormats.d.d = pDVar4;
      pQVar2[lVar3].supportedFormats.d.ptr = (b->supportedFormats).d.ptr;
      pQVar2[lVar3].supportedFormats.d.size = (b->supportedFormats).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      RVar17.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
      super_QFlagsStorage<QKmsPlane::Rotation>.i =
           (b->initialRotation).super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>;
      RVar18.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
      super_QFlagsStorage<QKmsPlane::Rotation>.i =
           (b->availableRotations).super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>;
      uVar19 = b->rotationPropertyId;
      uVar20 = b->crtcPropertyId;
      uVar13 = b->framebufferPropertyId;
      uVar14 = b->srcXPropertyId;
      uVar15 = b->srcYPropertyId;
      uVar16 = b->crtcXPropertyId;
      uVar9 = b->crtcYPropertyId;
      uVar10 = b->srcwidthPropertyId;
      uVar11 = b->srcheightPropertyId;
      uVar12 = b->crtcwidthPropertyId;
      uVar6 = b->zposPropertyId;
      uVar7 = b->blendOpPropertyId;
      uVar8 = b->activeCrtcId;
      pQVar2[lVar3].crtcheightPropertyId = b->crtcheightPropertyId;
      pQVar2[lVar3].zposPropertyId = uVar6;
      pQVar2[lVar3].blendOpPropertyId = uVar7;
      pQVar2[lVar3].activeCrtcId = uVar8;
      pQVar2[lVar3].crtcYPropertyId = uVar9;
      pQVar2[lVar3].srcwidthPropertyId = uVar10;
      pQVar2[lVar3].srcheightPropertyId = uVar11;
      pQVar2[lVar3].crtcwidthPropertyId = uVar12;
      pQVar2[lVar3].framebufferPropertyId = uVar13;
      pQVar2[lVar3].srcXPropertyId = uVar14;
      pQVar2[lVar3].srcYPropertyId = uVar15;
      pQVar2[lVar3].crtcXPropertyId = uVar16;
      pQVar2[lVar3].initialRotation =
           (Rotations)
           RVar17.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
           super_QFlagsStorage<QKmsPlane::Rotation>.i;
      pQVar2[lVar3].availableRotations =
           (Rotations)
           RVar18.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
           super_QFlagsStorage<QKmsPlane::Rotation>.i;
      pQVar2[lVar3].rotationPropertyId = uVar19;
      pQVar2[lVar3].crtcPropertyId = uVar20;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QKmsPlane>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }